

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  LogMessage local_78;
  Voidify local_61;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  uint8_t *puStack_50;
  int buffer_size;
  void *void_buffer;
  int current_position;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CodedInputStream *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  iVar3 = BufferSize(this);
  iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar3);
  local_20 = absl::lts_20250127::log_internal::Check_EQImpl(iVar2,iVar3,"0 == BufferSize()");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x2a2,pcVar4);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    bVar1 = anon_unknown_1::NextNonEmpty
                      (this->input_,&stack0xffffffffffffffb0,
                       (int *)((long)&absl_log_internal_check_op_result_1 + 4));
    if (bVar1) {
      this->buffer_ = puStack_50;
      this->buffer_end_ = this->buffer_ + absl_log_internal_check_op_result_1._4_4_;
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result_1._4_4_);
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
      local_60 = absl::lts_20250127::log_internal::Check_GEImpl(iVar2,iVar3,"buffer_size >= 0");
      if (local_60 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,0x2b7,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_78);
      }
      if (0x7fffffff - absl_log_internal_check_op_result_1._4_4_ < this->total_bytes_read_) {
        this->overflow_bytes_ =
             this->total_bytes_read_ - (0x7fffffff - absl_log_internal_check_op_result_1._4_4_);
        this->buffer_end_ = this->buffer_end_ + -(long)this->overflow_bytes_;
        this->total_bytes_read_ = 0x7fffffff;
      }
      else {
        this->total_bytes_read_ =
             absl_log_internal_check_op_result_1._4_4_ + this->total_bytes_read_;
      }
      RecomputeBufferLimits(this);
      this_local._7_1_ = true;
    }
    else {
      this->buffer_ = (uint8_t *)0x0;
      this->buffer_end_ = (uint8_t *)0x0;
      this_local._7_1_ = false;
    }
  }
  else {
    void_buffer._0_4_ = this->total_bytes_read_ - this->buffer_size_after_limit_;
    if ((this->total_bytes_limit_ <= (int)void_buffer) &&
       (this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::Refresh() {
  ABSL_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    ABSL_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = nullptr;
    buffer_end_ = nullptr;
    return false;
  }
}